

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::extract(UEFITool *this,UINT8 mode)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  UINT8 UVar4;
  byte bVar5;
  char cVar6;
  USTATUS errorCode;
  QArrayDataPointer<char16_t> local_e8;
  QFile outputFile;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QModelIndex index;
  QByteArray extracted;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::currentIndex();
  if (index.r < 0) {
    return;
  }
  if (index.c < 0) {
    return;
  }
  if (index.m == (QAbstractItemModel *)0x0) {
    return;
  }
  extracted.d.size = 0;
  extracted.d.d = (Data *)0x0;
  extracted.d.ptr = (char *)0x0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  errorCode = FfsOperations::extract(this->ffsOps,&index,(QString *)&local_68,&extracted,mode);
  if (errorCode != 0) {
    tr((QString *)&local_e8,"Extraction failed",(char *)0x0,-1);
    errorCodeToUString((QString *)&local_88,errorCode);
    QMessageBox::critical(this,&local_e8,&local_88,0x400,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    goto LAB_00123fbb;
  }
  operator+((QString *)&local_b8,&this->currentDir,(QChar)0x2f);
  operator+((QString *)&local_88,(QString *)&local_b8,(QString *)&local_68);
  QDir::toNativeSeparators((QString *)&local_e8);
  qVar3 = local_68.size;
  pcVar2 = local_68.ptr;
  pDVar1 = local_68.d;
  local_68.d = local_e8.d;
  local_68.ptr = local_e8.ptr;
  local_e8.d = pDVar1;
  local_e8.ptr = pcVar2;
  local_68.size = local_e8.size;
  local_e8.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  UVar4 = TreeModel::type(this->model,&index);
  bVar5 = TreeModel::subtype(this->model,&index);
  local_e8.size = 0;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (char16_t *)0x0;
  if (mode == '\0') {
    switch(UVar4) {
    case '=':
      tr((QString *)&local_b8,"Save capsule to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".cap");
      tr((QString *)&local_a0,"Capsule files (*.cap *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case '>':
      tr((QString *)&local_b8,"Save image to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".rom");
      tr((QString *)&local_a0,"Image files (*.rom *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case '?':
      tr((QString *)&local_b8,"Save region to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".rgn");
      tr((QString *)&local_a0,"Region files (*.rgn *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case '@':
      tr((QString *)&local_b8,"Save padding to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".pad");
      tr((QString *)&local_a0,"Padding files (*.pad *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case 'A':
      tr((QString *)&local_b8,"Save volume to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".vol");
      tr((QString *)&local_a0,"Volume files (*.vol *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case 'B':
      tr((QString *)&local_b8,"Save FFS file to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".ffs");
      tr((QString *)&local_a0,"FFS files (*.ffs *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case 'C':
      tr((QString *)&local_b8,"Save section to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".sct");
      tr((QString *)&local_a0,"Section files (*.sct *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    default:
      tr((QString *)&local_b8,"Save object to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".bin");
      tr((QString *)&local_a0,"Binary files (*.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
    }
  }
  else if (mode < 3) {
    switch(UVar4) {
    case '=':
      tr((QString *)&local_b8,"Save capsule body to image file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".rom");
      tr((QString *)&local_a0,"Image files (*.rom *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    default:
switchD_00123d36_caseD_3e:
      tr((QString *)&local_b8,"Save object body to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".bin");
      tr((QString *)&local_a0,"Binary files (*.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case 'A':
      tr((QString *)&local_b8,"Save volume body to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".vbd");
      tr((QString *)&local_a0,"Volume body files (*.vbd *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case 'B':
      tr((QString *)&local_b8,"Save FFS file body to file",(char *)0x0,-1);
      operator+((QString *)&outputFile,(QString *)&local_68,".fbd");
      tr((QString *)&local_a0,"FFS file body files (*.fbd *.bin);;All files (*)",(char *)0x0,-1);
      QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      break;
    case 'C':
      if (bVar5 - 0x10 < 3) {
        tr((QString *)&local_b8,"Save section body to EFI executable file",(char *)0x0,-1);
        operator+((QString *)&outputFile,(QString *)&local_68,".efi");
        tr((QString *)&local_a0,"EFI executable files (*.efi *.bin);;All files (*)",(char *)0x0,-1);
        QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      }
      else {
        if (bVar5 != 0x17) goto switchD_00123d36_caseD_3e;
        tr((QString *)&local_b8,"Save section body to volume file",(char *)0x0,-1);
        operator+((QString *)&outputFile,(QString *)&local_68,".vol");
        tr((QString *)&local_a0,"Volume files (*.vol *.bin);;All files (*)",(char *)0x0,-1);
        QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
      }
    }
  }
  else {
    tr((QString *)&local_b8,"Save object to file",(char *)0x0,-1);
    operator+((QString *)&outputFile,(QString *)&local_68,".bin");
    tr((QString *)&local_a0,"Binary files (*.bin);;All files (*)",(char *)0x0,-1);
    QFileDialog::getSaveFileName(&local_88,this,&local_b8,&outputFile,&local_a0,0,0);
  }
  qVar3 = local_e8.size;
  pcVar2 = local_e8.ptr;
  pDVar1 = local_e8.d;
  local_e8.d = local_88.d;
  local_e8.ptr = local_88.ptr;
  local_88.d = pDVar1;
  local_88.ptr = pcVar2;
  local_e8.size = local_88.size;
  local_88.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&outputFile);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QString::trimmed_helper((QString *)&local_88);
  qVar3 = local_88.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (qVar3 != 0) {
    QFile::QFile(&outputFile);
    QFile::setFileName((QString *)&outputFile);
    cVar6 = QFile::open(&outputFile,2);
    if (cVar6 == '\0') {
      tr((QString *)&local_88,"Extraction failed",(char *)0x0,-1);
      tr((QString *)&local_b8,"Can\'t open output file for rewriting",(char *)0x0,-1);
      QMessageBox::critical(this,&local_88,&local_b8,0x400,0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    else {
      QFile::resize((longlong)&outputFile);
      QIODevice::write((QByteArray *)&outputFile);
      QFileDevice::close();
    }
    QFile::~QFile(&outputFile);
  }
LAB_00123fbb:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&extracted.d);
  return;
}

Assistant:

void UEFITool::extract(const UINT8 mode)
{
    QModelIndex index = ui->structureTreeView->selectionModel()->currentIndex();
    if (!index.isValid())
        return;
    
    QByteArray extracted;
    QString name;
    USTATUS result = ffsOps->extract(index, name, extracted, mode);
    if (result) {
        QMessageBox::critical(this, tr("Extraction failed"), errorCodeToUString(result), QMessageBox::Ok);
        return;
    }
    
    name = QDir::toNativeSeparators(currentDir + QDir::separator() + name);
    
    //ui->statusBar->showMessage(name);
    
    UINT8 type = model->type(index);
    UINT8 subtype = model->subtype(index);
    QString path;
    if (mode == EXTRACT_MODE_AS_IS) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule to file"), name + ".cap",  tr("Capsule files (*.cap *.bin);;All files (*)")); break;
            case Types::Image:   path = QFileDialog::getSaveFileName(this, tr("Save image to file"), name + ".rom",  tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Region:  path = QFileDialog::getSaveFileName(this, tr("Save region to file"), name + ".rgn",  tr("Region files (*.rgn *.bin);;All files (*)")); break;
            case Types::Padding: path = QFileDialog::getSaveFileName(this, tr("Save padding to file"), name + ".pad",  tr("Padding files (*.pad *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume to file"), name + ".vol",  tr("Volume files (*.vol *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file to file"), name + ".ffs",  tr("FFS files (*.ffs *.bin);;All files (*)")); break;
            case Types::Section: path = QFileDialog::getSaveFileName(this, tr("Save section to file"), name + ".sct",  tr("Section files (*.sct *.bin);;All files (*)")); break;
            default:             path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else if (mode == EXTRACT_MODE_BODY || mode == EXTRACT_MODE_BODY_UNCOMPRESSED) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule body to image file"), name + ".rom", tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume body to file"), name + ".vbd", tr("Volume body files (*.vbd *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file body to file"), name + ".fbd", tr("FFS file body files (*.fbd *.bin);;All files (*)")); break;
            case Types::Section:
                if (subtype == EFI_SECTION_FIRMWARE_VOLUME_IMAGE) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to volume file"), name + ".vol", tr("Volume files (*.vol *.bin);;All files (*)")); break;
                }
                else if (subtype == EFI_SECTION_PE32
                         || subtype == EFI_SECTION_TE
                         || subtype == EFI_SECTION_PIC) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to EFI executable file"), name + ".efi", tr("EFI executable files (*.efi *.bin);;All files (*)")); break;
                }
            default: path = QFileDialog::getSaveFileName(this, tr("Save object body to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
    
    if (path.trimmed().isEmpty())
        return;
    
    QFile outputFile;
    outputFile.setFileName(path);
    if (!outputFile.open(QFile::WriteOnly)) {
        QMessageBox::critical(this, tr("Extraction failed"), tr("Can't open output file for rewriting"), QMessageBox::Ok);
        return;
    }
    outputFile.resize(0);
    outputFile.write(extracted);
    outputFile.close();
}